

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallScriptGenerator::AddScriptInstallRule
          (cmInstallScriptGenerator *this,ostream *os,Indent indent,string *script)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if (this->Code == true) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(script->_M_dataplus)._M_p,script->_M_string_length);
    pcVar3 = "\n";
    lVar2 = 1;
  }
  else {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"include(\"",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(script->_M_dataplus)._M_p,script->_M_string_length);
    pcVar3 = "\")\n";
    lVar2 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return;
}

Assistant:

void cmInstallScriptGenerator::AddScriptInstallRule(std::ostream& os,
                                                    Indent indent,
                                                    std::string const& script)
{
  if (this->Code) {
    os << indent << script << "\n";
  } else {
    os << indent << "include(\"" << script << "\")\n";
  }
}